

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rl_pacman_agent.hh
# Opt level: O0

void __thiscall RL_Pacman_Agent::RL_Pacman_Agent(RL_Pacman_Agent *this)

{
  size_type sVar1;
  allocator<double> local_81;
  vector<double,_std::allocator<double>_> local_80;
  allocator<double> local_61;
  vector<double,_std::allocator<double>_> local_60;
  allocator<double> local_41;
  value_type_conflict2 local_40;
  vector<double,_std::allocator<double>_> local_38;
  RL_Pacman_Agent *local_10;
  RL_Pacman_Agent *this_local;
  
  local_10 = this;
  Agent::Agent(&this->super_Agent);
  (this->super_Agent)._vptr_Agent = (_func_int **)&PTR_take_action_0014eca0;
  this->reward = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&this->previous_input);
  std::vector<double,_std::allocator<double>_>::vector(&this->input);
  std::vector<double,_std::allocator<double>_>::vector(&this->max_input);
  this->n_games = 1;
  Neural_Network::Neural_Network
            (&this->nn,RL_Pacman_Agent_Inputs::n_inputs,Arguments::n_hidden_layers,
             Arguments::n_hidden_neurons,1,Arguments::learning_rate,Arguments::activation_function);
  sVar1 = (size_type)RL_Pacman_Agent_Inputs::n_inputs;
  local_40 = 0.0;
  std::allocator<double>::allocator(&local_41);
  std::vector<double,_std::allocator<double>_>::vector(&local_38,sVar1,&local_40,&local_41);
  std::vector<double,_std::allocator<double>_>::operator=(&this->previous_input,&local_38);
  std::vector<double,_std::allocator<double>_>::~vector(&local_38);
  std::allocator<double>::~allocator(&local_41);
  sVar1 = (size_type)RL_Pacman_Agent_Inputs::n_inputs;
  std::allocator<double>::allocator(&local_61);
  std::vector<double,_std::allocator<double>_>::vector(&local_60,sVar1,&local_61);
  std::vector<double,_std::allocator<double>_>::operator=(&this->max_input,&local_60);
  std::vector<double,_std::allocator<double>_>::~vector(&local_60);
  std::allocator<double>::~allocator(&local_61);
  sVar1 = (size_type)RL_Pacman_Agent_Inputs::n_inputs;
  std::allocator<double>::allocator(&local_81);
  std::vector<double,_std::allocator<double>_>::vector(&local_80,sVar1,&local_81);
  std::vector<double,_std::allocator<double>_>::operator=(&this->input,&local_80);
  std::vector<double,_std::allocator<double>_>::~vector(&local_80);
  std::allocator<double>::~allocator(&local_81);
  this->mse_sum = 0.0;
  this->mse_sum_last = 0.0;
  return;
}

Assistant:

RL_Pacman_Agent() : reward(0), n_games(1),
                        nn(RL_Pacman_Agent_Inputs::n_inputs, Arguments::n_hidden_layers, Arguments::n_hidden_neurons, 1, Arguments::learning_rate, Arguments::activation_function)
    {
        previous_input = vector<double>(RL_Pacman_Agent_Inputs::n_inputs, 0.0);
        max_input = vector<double>(RL_Pacman_Agent_Inputs::n_inputs);
        input = vector<double>(RL_Pacman_Agent_Inputs::n_inputs);
        mse_sum_last = mse_sum = 0.0;
    }